

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O2

int AF_A_FiredChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  SWORD *pSVar1;
  VM_UBYTE VVar2;
  uint uVar3;
  DObject *this;
  bool bVar4;
  int iVar5;
  AActor *other;
  AActor *pAVar6;
  AActor *this_00;
  char *__assertion;
  double dVar7;
  DAngle local_30;
  _func_int **local_28;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053a957;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0053a947;
  this_00 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_0053a6b5;
    bVar4 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0053a957;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_0053a947;
LAB_0053a6b5:
    this_00 = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_0053a947:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0053a957;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar4)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053a957;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_0053a947;
    }
    if (((2 < (uint)numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0053a957:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                    ,0x88,"int AF_A_FiredChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  iVar5 = this_00->special1;
  obj = &this_00->target;
  other = GC::ReadBarrier<AActor>((AActor **)obj);
  if (this_00->reactiontime != 0) {
    this_00->reactiontime = this_00->reactiontime + -1;
  }
  if (this_00->threshold != 0) {
    this_00->threshold = this_00->threshold + -1;
  }
  dVar7 = BobSin((double)iVar5);
  dVar7 = dVar7 + (this_00->__Pos).Z;
  (this_00->__Pos).Z = dVar7;
  this_00->special1 = iVar5 + 2U & 0x3f;
  if (dVar7 < this_00->floorz + 64.0) {
    (this_00->__Pos).Z = dVar7 + 2.0;
  }
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar6 == (AActor *)0x0) ||
     (pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar6->flags).Value & 4) == 0)) {
    P_LookForPlayers(this_00,1,(FLookExParams *)0x0);
    return 0;
  }
  if (this_00->special2 < 1) {
    this_00->special2 = 0;
    (this_00->Vel).X = 0.0;
    (this_00->Vel).Y = 0.0;
    dVar7 = AActor::Distance2D(this_00,other,false);
    if ((512.0 <= dVar7) || (iVar5 = FRandom::operator()(&pr_firedemonchase), 0x1d < iVar5))
    goto LAB_0053a8a8;
    AActor::AngleTo((AActor *)&stack0xffffffffffffffd8,this_00,SUB81(other,0));
    iVar5 = FRandom::operator()(&pr_firedemonchase);
    local_30.Degrees = (double)local_28 + *(double *)(&DAT_00694b30 + (ulong)(iVar5 < 0x80) * 8);
    AActor::Thrust(this_00,&local_30,8.0);
    iVar5 = 3;
  }
  else {
    iVar5 = this_00->special2 + -1;
  }
  this_00->special2 = iVar5;
LAB_0053a8a8:
  FaceMovementDirection(this_00);
  if (this_00->special2 == 0) {
    pSVar1 = &this_00->movecount;
    *pSVar1 = *pSVar1 + -1;
    if ((*pSVar1 < 0) || (bVar4 = P_Move(this_00), !bVar4)) {
      P_NewChaseDir(this_00);
    }
  }
  uVar3 = (this_00->flags).Value;
  if ((char)uVar3 < '\0') {
    (this_00->flags).Value = uVar3 & 0xffffff7f;
  }
  else {
    bVar4 = P_CheckMissileRange(this_00);
    if ((bVar4) && (iVar5 = FRandom::operator()(&pr_firedemonchase), iVar5 < 0x14)) {
      AActor::SetState(this_00,this_00->MissileState,false);
      *(byte *)&(this_00->flags).Value = (byte)(this_00->flags).Value | 0x80;
      return 0;
    }
  }
  iVar5 = FRandom::operator()(&pr_firedemonchase);
  if (2 < iVar5) {
    return 0;
  }
  AActor::PlayActiveSound(this_00);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredChase)
{
	PARAM_ACTION_PROLOGUE;

	int weaveindex = self->special1;
	AActor *target = self->target;
	DAngle ang;
	double dist;

	if (self->reactiontime) self->reactiontime--;
	if (self->threshold) self->threshold--;

	// Float up and down
	self->AddZ(BobSin(weaveindex));
	self->special1 = (weaveindex + 2) & 63;

	// Ensure it stays above certain height
	if (self->Z() < self->floorz + 64)
	{
		self->AddZ(2);
	}

	if(!self->target || !(self->target->flags&MF_SHOOTABLE))
	{	// Invalid target
		P_LookForPlayers (self,true, NULL);
		return 0;
	}

	// Strafe
	if (self->special2 > 0)
	{
		self->special2--;
	}
	else
	{
		self->special2 = 0;
		self->Vel.X = self->Vel.Y = 0;
		dist = self->Distance2D(target);
		if (dist < FIREDEMON_ATTACK_RANGE)
		{
			if (pr_firedemonchase() < 30)
			{
				ang = self->AngleTo(target);
				if (pr_firedemonchase() < 128)
					ang += 90;
				else
					ang -= 90;
				self->Thrust(ang, 8);
				self->special2 = 3;		// strafe time
			}
		}
	}

	FaceMovementDirection (self);

	// Normal movement
	if (!self->special2)
	{
		if (--self->movecount<0 || !P_Move (self))
		{
			P_NewChaseDir (self);
		}
	}

	// Do missile attack
	if (!(self->flags & MF_JUSTATTACKED))
	{
		if (P_CheckMissileRange (self) && (pr_firedemonchase() < 20))
		{
			self->SetState (self->MissileState);
			self->flags |= MF_JUSTATTACKED;
			return 0;
		}
	}
	else
	{
		self->flags &= ~MF_JUSTATTACKED;
	}

	// make active sound
	if (pr_firedemonchase() < 3)
	{
		self->PlayActiveSound ();
	}
	return 0;
}